

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O1

int __thiscall
CGraphicsBackend_SDL_OpenGL::GetVideoModes
          (CGraphicsBackend_SDL_OpenGL *this,CVideoMode *pModes,int MaxModes,int Screen)

{
  CVideoMode CVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long in_FS_OFFSET;
  SDL_DisplayMode Mode;
  undefined1 local_50 [4];
  int local_4c;
  int iStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = SDL_GetNumDisplayModes(Screen);
  if (iVar2 < 0) {
    uVar4 = SDL_GetError();
    uVar7 = 0;
    dbg_msg("gfx","unable to get the number of display modes: %s",uVar4);
  }
  else {
    uVar7 = 0;
    if (0 < MaxModes && iVar2 != 0) {
      iVar6 = 0;
      uVar7 = 0;
      do {
        iVar3 = SDL_GetDisplayMode(Screen,iVar6,local_50);
        if (iVar3 < 0) {
          uVar4 = SDL_GetError();
          dbg_msg("gfx","unable to get display mode: %s",uVar4);
        }
        else {
          if (0 < (int)uVar7) {
            uVar5 = 0;
            do {
              if ((pModes[uVar5].m_Width == local_4c) && (pModes[uVar5].m_Height == iStack_48))
              goto LAB_0011df90;
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar5);
          }
          CVar1.m_Height = iStack_48;
          CVar1.m_Width = local_4c;
          pModes[(int)uVar7] = CVar1;
          uVar7 = uVar7 + 1;
        }
LAB_0011df90:
        iVar6 = iVar6 + 1;
      } while ((iVar6 < iVar2) && ((int)uVar7 < MaxModes));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar7;
}

Assistant:

int CGraphicsBackend_SDL_OpenGL::GetVideoModes(CVideoMode *pModes, int MaxModes, int Screen)
{
	int NumModes = SDL_GetNumDisplayModes(Screen);
	if(NumModes < 0)
	{
		dbg_msg("gfx", "unable to get the number of display modes: %s", SDL_GetError());
		return 0;
	}

	int ModesCount = 0;
	for(int i = 0; i < NumModes && ModesCount < MaxModes; i++)
	{
		SDL_DisplayMode Mode;
		if(SDL_GetDisplayMode(Screen, i, &Mode) < 0)
		{
			dbg_msg("gfx", "unable to get display mode: %s", SDL_GetError());
			continue;
		}

		bool AlreadyFound = false;
		for(int j = 0; j < ModesCount; j++)
		{
			if(pModes[j].m_Width == Mode.w && pModes[j].m_Height == Mode.h)
			{
				AlreadyFound = true;
				break;
			}
		}
		if(AlreadyFound)
			continue;

		pModes[ModesCount].m_Width = Mode.w;
		pModes[ModesCount].m_Height = Mode.h;
		ModesCount++;
	}
	return ModesCount;
}